

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O2

void selection_changed(Fl_Type *p)

{
  Fl_Type *pFVar1;
  Fl_Type **ppFVar2;
  Fl_Type *pFVar3;
  Fl_Type *pFVar4;
  void *in_RSI;
  
  if (((p != (Fl_Type *)0x0 && the_panel != (Fl_Window *)0x0) &&
      (((the_panel->super_Fl_Group).super_Fl_Widget.flags_ & 2) == 0)) &&
     (set_cb((Fl_Button *)p,in_RSI), haderror == '\x01')) {
    Fl_Type::current = (Fl_Type *)0x0;
    ppFVar2 = &Fl_Type::first;
    while (pFVar1 = *ppFVar2, pFVar1 != (Fl_Type *)0x0) {
      pFVar1->new_selected = pFVar1->selected;
      pFVar3 = pFVar1;
      if (pFVar1->selected == '\0') {
        pFVar3 = (Fl_Type *)0x0;
      }
      if (Fl_Type::current == (Fl_Type *)0x0) {
        Fl_Type::current = pFVar3;
      }
      ppFVar2 = &pFVar1->next;
    }
    if (p->selected != '\0') {
      Fl_Type::current = p;
    }
    redraw_browser();
    return;
  }
  pFVar1 = (Fl_Type *)0x0;
  ppFVar2 = &Fl_Type::first;
  while (pFVar3 = *ppFVar2, pFVar3 != (Fl_Type *)0x0) {
    pFVar3->selected = pFVar3->new_selected;
    pFVar4 = pFVar3;
    if (pFVar3->new_selected == '\0') {
      pFVar4 = (Fl_Type *)0x0;
    }
    if (pFVar1 == (Fl_Type *)0x0) {
      pFVar1 = pFVar4;
    }
    ppFVar2 = &pFVar3->next;
  }
  if ((p == (Fl_Type *)0x0) || (Fl_Type::current = p, p->selected == '\0')) {
    Fl_Type::current = pFVar1;
  }
  check_redraw_corresponding_parent(Fl_Type::current);
  redraw_overlays();
  load_panel();
  update_sourceview_position();
  return;
}

Assistant:

void selection_changed(Fl_Type *p) {
  // store all changes to the current selected objects:
  if (p && the_panel && the_panel->visible()) {
    set_cb(0,0);
    // if there was an error, we try to leave the selected set unchanged:
    if (haderror) {
      Fl_Type *q = 0;
      for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
	o->new_selected = o->selected;
	if (!q && o->selected) q = o;
      }
      if (!p || !p->selected) p = q;
      Fl_Type::current = p;
      redraw_browser();
      return;
    }
  }
  // update the selected flags to new set:
  Fl_Type *q = 0;
  for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
    o->selected = o->new_selected;
    if (!q && o->selected) q = o;
  }
  if (!p || !p->selected) p = q;
  Fl_Type::current = p;
  check_redraw_corresponding_parent(p);
  redraw_overlays();
  // load the panel with the new settings:
  load_panel();
  // update the source viewer to show the code for the selected object
  update_sourceview_position();
}